

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tx.c
# Opt level: O0

_Bool tx_coinbase(char *tx_hex)

{
  int iVar1;
  long lStack_38;
  int ret;
  size_t is_coinbase;
  char *pcStack_28;
  uint32_t flags;
  char *new_hex;
  wally_tx *tx;
  char *tx_hex_local;
  
  is_coinbase._4_4_ = 1;
  tx = (wally_tx *)tx_hex;
  iVar1 = wally_tx_from_hex(tx_hex,1,&new_hex);
  if (((iVar1 != 0) || (iVar1 = wally_tx_to_hex(new_hex,1,&stack0xffffffffffffffd8), iVar1 != 0)) ||
     (iVar1 = strcmp((char *)tx,pcStack_28), iVar1 != 0)) {
    return false;
  }
  iVar1 = wally_free_string(pcStack_28);
  if (iVar1 != 0) {
    return false;
  }
  iVar1 = wally_tx_is_coinbase(new_hex,&stack0xffffffffffffffc8);
  if ((iVar1 == 0) && (lStack_38 != 0)) {
    iVar1 = wally_tx_free(new_hex);
    if (iVar1 == 0) {
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool tx_coinbase(const char *tx_hex)
{
    struct wally_tx *tx;
    char *new_hex;
    const uint32_t flags = WALLY_TX_FLAG_USE_WITNESS;
    size_t is_coinbase;
    int ret;

    /* Unserialize and serialize the tx and verify they match */
    ret = wally_tx_from_hex(tx_hex, flags, &tx);
    check_ret(ret);

    ret = wally_tx_to_hex(tx, flags, &new_hex);
    if (ret != WALLY_OK || strcmp(tx_hex, new_hex))
        return false;

    ret = wally_free_string(new_hex);
    check_ret(ret);

    ret = wally_tx_is_coinbase(tx, &is_coinbase);
    if (ret != WALLY_OK || !is_coinbase)
        return false;

    /* Clean up (for valgrind heap checking) */
    ret = wally_tx_free(tx);
    check_ret(ret);

    return true;
}